

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

int match_oplist(int op,...)

{
  int iVar1;
  char in_AL;
  uint uVar2;
  undefined8 in_RCX;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int local_d8 [2];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list args;
  
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_d8;
  piVar3 = (int *)&stack0x00000008;
  args[0]._0_8_ = piVar3;
  local_28 = 0x3000000008;
  uVar2 = 8;
  do {
    if (uVar2 < 0x29) {
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 8;
      local_28 = CONCAT44(local_28._4_4_,uVar2);
      piVar5 = (int *)((long)local_d8 + uVar4);
    }
    else {
      args[0]._0_8_ = piVar3 + 2;
      piVar5 = piVar3;
      piVar3 = piVar3 + 2;
    }
    iVar1 = *piVar5;
  } while ((iVar1 != 0) && (iVar1 != op));
  return (uint)(iVar1 != 0);
}

Assistant:

static int match_oplist(int op, ...)
{
	va_list args;
	int nextop;

	va_start(args, op);
	do {
		nextop = va_arg(args, int);
	} while (nextop != 0 && nextop != op);
	va_end(args);

	return nextop != 0;
}